

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlidna.cpp
# Opt level: O0

QString * qt_punycodeDecoder(QString *pc)

{
  long lVar1;
  QLatin1StringView s;
  bool bVar2;
  enable_if_t<std::is_unsigned_v<unsigned_int>____std::is_signed_v<unsigned_int>,_bool> eVar3;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_bool> eVar4;
  char16_t cVar5;
  int iVar6;
  qsizetype qVar7;
  size_type sVar8;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  uint outputLength;
  uint t;
  uint digit;
  uint k;
  uint oldi;
  uint cnt;
  int delimiterPos;
  int start;
  uint bias;
  uint tmp;
  uint w;
  uint i;
  uint n;
  u32string output;
  undefined4 in_stack_fffffffffffffed8;
  char32_t in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeec;
  QChar in_stack_fffffffffffffeee;
  undefined4 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef4;
  undefined1 in_stack_fffffffffffffef5;
  QChar in_stack_fffffffffffffef6;
  qsizetype in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  QString *position;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  uint uVar9;
  uint local_cc;
  undefined4 in_stack_ffffffffffffff38;
  uint uVar10;
  undefined4 in_stack_ffffffffffffff3c;
  uint uVar11;
  uint local_c0;
  uint local_94;
  QMessageLogger local_80;
  uint local_5c;
  QChar local_56;
  uint local_54 [8];
  QChar local_32;
  uint local_30;
  char32_t local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = L'\x80';
  local_30 = 0;
  local_94 = 0x48;
  position = in_RDI;
  qVar7 = QString::size(in_RSI);
  if (qVar7 < 0x40) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT26(in_stack_fffffffffffffeee.ucs,
                                CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)),
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    s.m_data = in_stack_ffffffffffffff08;
    s.m_size = in_stack_ffffffffffffff00;
    bVar2 = QString::startsWith((QString *)
                                CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),s,
                                CaseInsensitive);
    if (bVar2) {
      QChar::QChar<char16_t,_true>(&local_32,L'-');
      qVar7 = QString::lastIndexOf
                        ((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffeee,in_stack_fffffffffffffedc);
      if ((int)qVar7 < 4) {
        std::__cxx11::u32string::u32string
                  ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   CONCAT26(in_stack_fffffffffffffef6.ucs,
                            CONCAT15(in_stack_fffffffffffffef5,
                                     CONCAT14(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)))
                  );
      }
      else {
        QString::mid((QString *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     (qsizetype)position,(qsizetype)in_RDI);
        QString::toStdU32String_abi_cxx11_
                  ((QString *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        QString::~QString((QString *)0x30df11);
      }
      local_c0 = (int)qVar7 + 1;
      while (qVar7 = QString::size(in_RSI), local_c0 < (uint)qVar7) {
        local_54[0] = 1;
        uVar10 = 0x24;
        uVar11 = local_30;
        while (qVar7 = QString::size(in_RSI), local_c0 < (uint)qVar7) {
          local_c0 = local_c0 + 1;
          in_stack_fffffffffffffef6 =
               QString::at((QString *)
                           CONCAT26(in_stack_fffffffffffffeee.ucs,
                                    CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)),
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
          local_56 = in_stack_fffffffffffffef6;
          cVar5 = QChar::unicode(&local_56);
          local_cc = (uint)(ushort)cVar5;
          if (local_cc - 0x30 < 10) {
            local_cc = local_cc - 0x16;
          }
          else if (local_cc - 0x41 < 0x1a) {
            local_cc = local_cc - 0x41;
          }
          else if (local_cc - 0x61 < 0x1a) {
            local_cc = local_cc - 0x61;
          }
          else {
            local_cc = 0x24;
          }
          if (0x23 < local_cc) {
            QString::QString((QString *)0x30e081);
            goto LAB_0030e335;
          }
          local_5c = 0xaaaaaaaa;
          in_stack_fffffffffffffef5 = qMulOverflow<unsigned_int>(local_cc,local_54[0],&local_5c);
          if (((bool)in_stack_fffffffffffffef5) ||
             (in_stack_fffffffffffffef4 = qAddOverflow<unsigned_int>(local_30,local_5c,&local_30),
             (bool)in_stack_fffffffffffffef4)) {
            QString::QString((QString *)0x30e0f6);
            goto LAB_0030e335;
          }
          if (local_94 < uVar10) {
            if (uVar10 < local_94 + 0x1a) {
              uVar9 = uVar10 - local_94;
            }
            else {
              uVar9 = 0x1a;
            }
          }
          else {
            uVar9 = 1;
          }
          if (local_cc < uVar9) break;
          eVar3 = qMulOverflow<unsigned_int>(local_54[0],0x24 - uVar9,local_54);
          in_stack_fffffffffffffef0 = CONCAT13(eVar3,(int3)in_stack_fffffffffffffef0);
          if (eVar3) {
            QString::QString((QString *)0x30e194);
            goto LAB_0030e335;
          }
          uVar10 = uVar10 + 0x24;
        }
        sVar8 = std::__cxx11::
                basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                length((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)&stack0xffffffffffffffd8);
        iVar6 = (int)sVar8;
        local_94 = adapt(local_30 - uVar11,iVar6 + 1,uVar11 == 0);
        in_stack_fffffffffffffeec = (undefined2)local_94;
        in_stack_fffffffffffffeee.ucs = (char16_t)(local_94 >> 0x10);
        eVar4 = qAddOverflow<unsigned_int>(local_2c,local_30 / (iVar6 + 1U),(uint *)&local_2c);
        in_stack_fffffffffffffee8 = CONCAT13(eVar4,(int3)in_stack_fffffffffffffee8);
        if (eVar4) {
          QString::QString((QString *)0x30e236);
          goto LAB_0030e335;
        }
        local_30 = local_30 % (iVar6 + 1U);
        if ((uint)local_2c < 0x80) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)
                     CONCAT26(in_stack_fffffffffffffef6.ucs,
                              CONCAT15(in_stack_fffffffffffffef5,
                                       CONCAT14(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                                      )),
                     (char *)CONCAT26(in_stack_fffffffffffffeee.ucs,
                                      CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
                     ,in_stack_fffffffffffffee4,
                     (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          QMessageLogger::warning
                    (&local_80,"Attempt to insert a basic codepoint. Unhandled overflow?");
          QString::QString((QString *)0x30e2a1);
          goto LAB_0030e335;
        }
        bVar2 = QChar::isSurrogate(local_2c);
        if ((bVar2) || (0x10ffff < (uint)local_2c)) {
          QString::QString((QString *)0x30e2d5);
          goto LAB_0030e335;
        }
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::insert((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 CONCAT26(in_stack_fffffffffffffef6.ucs,
                          CONCAT15(in_stack_fffffffffffffef5,
                                   CONCAT14(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))),
                 CONCAT26(in_stack_fffffffffffffeee.ucs,
                          CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)),
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffedc);
        local_30 = local_30 + 1;
      }
      QString::fromStdU32String
                ((u32string *)
                 CONCAT26(in_stack_fffffffffffffeee.ucs,
                          CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)));
LAB_0030e335:
      std::__cxx11::u32string::~u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    }
    else {
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (QString *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    }
  }
  else {
    QString::QString((QString *)0x30dd97);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return position;
  }
  __stack_chk_fail();
}

Assistant:

Q_AUTOTEST_EXPORT QString qt_punycodeDecoder(const QString &pc)
{
    uint n = initial_n;
    uint i = 0;
    uint bias = initial_bias;

    // Do not try to decode strings longer than allowable for a domain label.
    // Non-ASCII strings are not allowed here anyway, so there is no need
    // to account for surrogates.
    if (pc.size() > MaxDomainLabelLength)
        return QString();

    // strip any ACE prefix
    int start = pc.startsWith("xn--"_L1) ? 4 : 0;
    if (!start)
        return pc;

    // find the last delimiter character '-' in the input array. copy
    // all data before this delimiter directly to the output array.
    int delimiterPos = pc.lastIndexOf(u'-');
    auto output = delimiterPos < 4 ? std::u32string()
                                   : pc.mid(start, delimiterPos - start).toStdU32String();

    // if a delimiter was found, skip to the position after it;
    // otherwise start at the front of the input string. everything
    // before the delimiter is assumed to be basic code points.
    uint cnt = delimiterPos + 1;

    // loop through the rest of the input string, inserting non-basic
    // characters into output as we go.
    while (cnt < (uint) pc.size()) {
        uint oldi = i;
        uint w = 1;

        // find the next index for inserting a non-basic character.
        for (uint k = base; cnt < (uint) pc.size(); k += base) {
            // grab a character from the punycode input and find its
            // delta digit (each digit code is part of the
            // variable-length integer delta)
            uint digit = pc.at(cnt++).unicode();
            if (digit - 48 < 10) digit -= 22;
            else if (digit - 65 < 26) digit -= 65;
            else if (digit - 97 < 26) digit -= 97;
            else digit = base;

            // Fail if the code point has no digit value
            if (digit >= base)
                return QString();

            // i = i + digit * w, fail on overflow
            uint tmp;
            if (qMulOverflow<uint>(digit, w, &tmp) || qAddOverflow<uint>(i, tmp, &i))
                return QString();

            // detect threshold to stop reading delta digits
            uint t;
            if (k <= bias) t = tmin;
            else if (k >= bias + tmax) t = tmax;
            else t = k - bias;

            if (digit < t) break;

            // w = w * (base - t), fail on overflow
            if (qMulOverflow<uint>(w, base - t, &w))
                return QString();
        }

        // find new bias and calculate the next non-basic code
        // character.
        uint outputLength = static_cast<uint>(output.length());
        bias = adapt(i - oldi, outputLength + 1, oldi == 0);

        // n = n + i div (length(output) + 1), fail on overflow
        if (qAddOverflow<uint>(n, i / (outputLength + 1), &n))
            return QString();

        // allow the deltas to wrap around
        i %= (outputLength + 1);

        // if n is a basic code point then fail; this should not happen with
        // correct implementation of Punycode, but check just n case.
        if (n < initial_n) {
            // Don't use Q_ASSERT() to avoid possibility of DoS
            qWarning("Attempt to insert a basic codepoint. Unhandled overflow?");
            return QString();
        }

        // Surrogates should normally be rejected later by other IDNA code.
        // But because of Qt's use of UTF-16 to represent strings the
        // IDNA code is not able to distinguish characters represented as pairs
        // of surrogates from normal code points. This is why surrogates are
        // not allowed here.
        //
        // Allowing surrogates would lead to non-unique (after normalization)
        // encoding of strings with non-BMP characters.
        //
        // Punycode that encodes characters outside the Unicode range is also
        // invalid and is rejected here.
        if (QChar::isSurrogate(n) || n > QChar::LastValidCodePoint)
            return QString();

        // insert the character n at position i
        output.insert(i, 1, static_cast<char32_t>(n));
        ++i;
    }

    return QString::fromStdU32String(output);
}